

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Orientation * __thiscall
stateObservation::kine::Orientation::integrate(Orientation *this,Vector3 *dt_x_omega)

{
  Quaternion<double,_0> *_b;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *other;
  Quaternion q;
  Quaternion QStack_e8;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  local_c8 [16];
  Quaternion<double,_0> local_b8 [2];
  Matrix3 local_68;
  
  other = (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
           *)&QStack_e8;
  check_(this);
  if ((this->q_).isSet_.b_ == true) {
    _b = &(this->q_).v_;
    if ((this->m_).isSet_.b_ != true) {
      rotationVectorToQuaternion((Quaternion *)&local_68,dt_x_omega);
      CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::chckitm_check_(&this->q_)
      ;
      Eigen::internal::
      quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
                ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_68,
                 (QuaternionBase<Eigen::Quaternion<double,_0>_> *)_b);
      CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator=
                (&this->q_,local_b8);
      return this;
    }
    rotationVectorToQuaternion(&QStack_e8,dt_x_omega);
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::chckitm_check_(&this->q_);
    Eigen::internal::
    quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
              ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&QStack_e8,
               (QuaternionBase<Eigen::Quaternion<double,_0>_> *)_b);
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator=
              (&this->q_,local_b8);
    Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
              ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&QStack_e8);
    CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
              (&this->m_);
    other = local_c8;
  }
  else {
    rotationVectorToRotationMatrix(&local_68,dt_x_omega);
    CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
              (&this->m_);
  }
  *(Matrix3 **)other = &local_68;
  *(Matrix<double,_3,_3,_0,_3,_3> **)(other + 8) = &(this->m_).v_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_b8,other);
  CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::operator=
            (&this->m_,(Matrix<double,_3,_3,_0,_3,_3> *)local_b8);
  return this;
}

Assistant:

inline const Orientation & Orientation::integrate(Vector3 dt_x_omega)
{
  check_();
  if(q_.isSet())
  {
    if(isMatrixSet())
    {
      Quaternion q = kine::rotationVectorToQuaternion(dt_x_omega);
      q_ = q * q_();
      m_ = q.toRotationMatrix() * m_();
    }
    else
    {
      q_ = kine::rotationVectorToQuaternion(dt_x_omega) * q_();
    }
  }
  else
  {
    m_ = kine::rotationVectorToRotationMatrix(dt_x_omega) * m_();
  }
  return *this;
}